

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::OnTableCopyExpr(Validator *this,TableCopyExpr *expr)

{
  Result RVar1;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_78,&expr->dst_table);
  Var::Var(&local_c0,&expr->src_table);
  RVar1 = SharedValidator::OnTableCopy
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)45>).super_Expr.loc,
                     &local_78,&local_c0);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnTableCopyExpr(TableCopyExpr* expr) {
  result_ |=
      validator_.OnTableCopy(expr->loc, expr->dst_table, expr->src_table);
  return Result::Ok;
}